

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

bool __thiscall
chrono::ChSystem::DoStaticAnalysis(ChSystem *this,shared_ptr<chrono::ChStaticAnalysis> *analysis)

{
  ChVisualSystem *pCVar1;
  
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  this->setupcount = 0;
  this->solvecount = 0;
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  Update(this,true);
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3a])
            (this,(this->descriptor).
                  super___shared_ptr<chrono::ChSystemDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  (*((analysis->super___shared_ptr<chrono::ChStaticAnalysis,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_ChStaticAnalysis[2])();
  pCVar1 = this->visual_system;
  if (pCVar1 != (ChVisualSystem *)0x0) {
    (**(code **)(*(long *)pCVar1 + 0x58))(pCVar1,this);
  }
  return true;
}

Assistant:

bool ChSystem::DoStaticAnalysis(std::shared_ptr<ChStaticAnalysis> analysis) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    solvecount = 0;
    setupcount = 0;

    Setup();
    Update();

    DescriptorPrepareInject(*descriptor);

    analysis->StaticAnalysis();

    // Update any attached visualization system
    if (visual_system)
        visual_system->OnUpdate(this);

    return true;
}